

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

void endElementNsDebug(void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI)

{
  callbacks = callbacks + 1;
  fprintf((FILE *)SAXdebug,"SAX.endElementNs(%s",localname);
  if (prefix == (xmlChar *)0x0) {
    fwrite(", NULL",6,1,(FILE *)SAXdebug);
  }
  else {
    fprintf((FILE *)SAXdebug,", %s",prefix);
  }
  if (URI != (xmlChar *)0x0) {
    fprintf((FILE *)SAXdebug,", \'%s\')\n",URI);
    return;
  }
  fwrite(", NULL)\n",8,1,(FILE *)SAXdebug);
  return;
}

Assistant:

static void
endElementNsDebug(void *ctx ATTRIBUTE_UNUSED,
                  const xmlChar *localname,
                  const xmlChar *prefix,
                  const xmlChar *URI)
{
    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.endElementNs(%s", (char *) localname);
    if (prefix == NULL)
	fprintf(SAXdebug, ", NULL");
    else
	fprintf(SAXdebug, ", %s", (char *) prefix);
    if (URI == NULL)
	fprintf(SAXdebug, ", NULL)\n");
    else
	fprintf(SAXdebug, ", '%s')\n", (char *) URI);
}